

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# driver.cpp
# Opt level: O0

DomObjectHashConstIt<DomButtonGroup> __thiscall
Driver::findByAttributeNameIt<DomButtonGroup>
          (Driver *this,DomObjectHash<DomButtonGroup> *domHash,QString *name)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  QHash<const_DomButtonGroup_*,_QString> *in_RDX;
  long in_FS_OFFSET;
  piter pVar4;
  piter pVar5;
  const_iterator end;
  const_iterator it;
  DomButtonGroup *in_stack_ffffffffffffff88;
  QString *in_stack_ffffffffffffff90;
  const_iterator *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  piter local_18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pVar4 = (piter)QHash<const_DomButtonGroup_*,_QString>::cend
                           ((QHash<const_DomButtonGroup_*,_QString> *)in_stack_ffffffffffffff98);
  pVar5 = (piter)QHash<const_DomButtonGroup_*,_QString>::cbegin(in_RDX);
  while (bVar2 = QHash<const_DomButtonGroup_*,_QString>::const_iterator::operator!=
                           (in_stack_ffffffffffffff98,(const_iterator *)in_stack_ffffffffffffff90),
        local_18 = pVar4, bVar2) {
    QHash<const_DomButtonGroup_*,_QString>::const_iterator::key((const_iterator *)0x185d8c);
    DomButtonGroup::attributeName(in_stack_ffffffffffffff88);
    bVar3 = ::operator==(in_stack_ffffffffffffff90,&in_stack_ffffffffffffff88->m_attr_name);
    QString::~QString((QString *)0x185db6);
    local_18 = pVar5;
    if ((bVar3 & 1) != 0) break;
    QHash<const_DomButtonGroup_*,_QString>::const_iterator::operator++
              ((const_iterator *)CONCAT17(bVar3,in_stack_ffffffffffffffa0));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (DomObjectHashConstIt<DomButtonGroup>)local_18;
}

Assistant:

Driver::DomObjectHashConstIt<DomClass>
    Driver::findByAttributeNameIt(const DomObjectHash<DomClass> &domHash,
                                  const QString &name) const
{
    const auto end = domHash.cend();
    for (auto it = domHash.cbegin(); it != end; ++it) {
        if (it.key()->attributeName() == name)
            return it;
    }
    return end;
}